

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverseType
          (Node *this,Reader *type,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  uint uVar1;
  undefined2 *puVar2;
  uint64_t depId;
  bool bVar3;
  StructReader local_b8;
  StructReader local_88;
  PointerReader local_58;
  
  local_88.segment._0_4_ = 0;
  local_88.segment._4_4_ = 0;
  local_88.capTable._0_4_ = 0;
  local_88.capTable._4_4_ = 0;
  local_b8.data = (void *)0x0;
  local_b8.pointers._0_6_ = 0;
  local_b8.segment = (SegmentReader *)0x0;
  local_b8.capTable = (CapTableReader *)0x0;
  local_b8.pointers._6_2_ = 0;
  local_b8.dataSize = 0;
  local_b8.pointerCount = 0;
  local_b8.nestingLimit = 0x7fffffff;
  uVar1 = (type->_reader).dataSize;
  if (0xf < uVar1) {
    puVar2 = (undefined2 *)(type->_reader).data;
    switch(*puVar2) {
    case 0xe:
      bVar3 = (type->_reader).pointerCount == 0;
      local_58.pointer = (type->_reader).pointers;
      if (bVar3) {
        local_58.pointer = (WirePointer *)0x0;
      }
      local_58.nestingLimit = 0x7fffffff;
      if (!bVar3) {
        local_88.segment._0_4_ = *(undefined4 *)&(type->_reader).segment;
        local_88.segment._4_4_ = *(undefined4 *)((long)&(type->_reader).segment + 4);
        local_88.capTable._0_4_ = *(undefined4 *)&(type->_reader).capTable;
        local_88.capTable._4_4_ = *(undefined4 *)((long)&(type->_reader).capTable + 4);
        local_58.nestingLimit = (type->_reader).nestingLimit;
      }
      local_58.segment._0_4_ = local_88.segment._0_4_;
      local_58.segment._4_4_ = local_88.segment._4_4_;
      local_58.capTable._0_4_ = local_88.capTable._0_4_;
      local_58.capTable._4_4_ = local_88.capTable._4_4_;
      capnp::_::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
      traverseType(this,(Reader *)&local_88,eagerness,seen,finalLoader,sourceInfo);
      break;
    case 0xf:
    case 0x10:
    case 0x11:
      if (uVar1 < 0x80) {
        depId = 0;
      }
      else {
        depId = *(uint64_t *)(puVar2 + 4);
      }
      bVar3 = (type->_reader).pointerCount == 0;
      local_88.data = (type->_reader).pointers;
      if (bVar3) {
        local_88.data = (WirePointer *)0x0;
      }
      local_88.pointers._0_4_ = 0x7fffffff;
      if (!bVar3) {
        local_88.segment._0_4_ = *(undefined4 *)&(type->_reader).segment;
        local_88.segment._4_4_ = *(undefined4 *)((long)&(type->_reader).segment + 4);
        local_88.capTable._0_4_ = *(undefined4 *)&(type->_reader).capTable;
        local_88.capTable._4_4_ = *(undefined4 *)((long)&(type->_reader).capTable + 4);
        local_88.pointers._0_4_ = (type->_reader).nestingLimit;
      }
      capnp::_::PointerReader::getStruct(&local_b8,(PointerReader *)&local_88,(word *)0x0);
      traverseDependency(this,depId,eagerness,seen,finalLoader,sourceInfo,false);
      traverseBrand(this,(Reader *)&local_b8,eagerness,seen,finalLoader,sourceInfo);
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverseType(const schema::Type::Reader& type, uint eagerness,
                                  std::unordered_map<Node*, uint>& seen,
                                  const SchemaLoader& finalLoader,
                                  kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint64_t id = 0;
  schema::Brand::Reader brand;
  switch (type.which()) {
    case schema::Type::STRUCT:
      id = type.getStruct().getTypeId();
      brand = type.getStruct().getBrand();
      break;
    case schema::Type::ENUM:
      id = type.getEnum().getTypeId();
      brand = type.getEnum().getBrand();
      break;
    case schema::Type::INTERFACE:
      id = type.getInterface().getTypeId();
      brand = type.getInterface().getBrand();
      break;
    case schema::Type::LIST:
      traverseType(type.getList().getElementType(), eagerness, seen, finalLoader, sourceInfo);
      return;
    default:
      return;
  }

  traverseDependency(id, eagerness, seen, finalLoader, sourceInfo);
  traverseBrand(brand, eagerness, seen, finalLoader, sourceInfo);
}